

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O2

Sheet * __thiscall Excel::Book::sheet(Book *this,size_t index)

{
  pointer puVar1;
  wostream *pwVar2;
  Exception *this_00;
  wstring local_1c0;
  wstringstream stream;
  wostream local_190 [376];
  
  puVar1 = (this->m_sheets).
           super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->m_sheets).
                            super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (Sheet *)((_Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>)
                    puVar1[index]._M_t.
                    super___uniq_ptr_impl<Excel::Sheet,_std::default_delete<Excel::Sheet>_>._M_t).
                    super__Tuple_impl<0UL,_Excel::Sheet_*,_std::default_delete<Excel::Sheet>_>;
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&stream);
  pwVar2 = std::operator<<(local_190,L"There is no such sheet with index : ");
  std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstringbuf::str();
  Exception::Exception(this_00,&local_1c0);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline Sheet *
Book::sheet( size_t index ) const
{
	if( index < m_sheets.size() )
		return m_sheets[ index ].get();

	std::wstringstream stream;
	stream << L"There is no such sheet with index : " << index;

	throw Exception( stream.str() );
}